

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O0

void createDListR(DLNode **L,int *a,int n)

{
  DLNode *pDVar1;
  int local_34;
  DLNode *pDStack_30;
  int i;
  DLNode *r;
  DLNode *s;
  int n_local;
  int *a_local;
  DLNode **L_local;
  
  pDVar1 = (DLNode *)malloc(0x18);
  *L = pDVar1;
  (*L)->prior = (DLNode *)0x0;
  (*L)->next = (DLNode *)0x0;
  pDStack_30 = *L;
  for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
    pDVar1 = (DLNode *)malloc(0x18);
    pDVar1->data = a[local_34];
    pDStack_30->next = pDVar1;
    pDVar1->prior = pDStack_30;
    pDStack_30 = pDVar1;
  }
  pDStack_30->next = (DLNode *)0x0;
  return;
}

Assistant:

void createDListR(DLNode *&L, int a[], int n) { //尾插法建立双链表
    DLNode *s,*r;
    L = (DLNode*)malloc(sizeof(DLNode));
    L->prior = NULL;
    L->next = NULL;
    r = L;  //和单链表一样，r始终指向终端结点，此时头结点即终端结点
    for(int i = 0; i < n; ++i) {
        s = (DLNode*)malloc(sizeof(DLNode));  //创建新结点
        s->data = a[i];
        r->next = s;
        s->prior = r;
        r = s;
    }
    r->next = NULL;
}